

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreRecursive.cpp
# Opt level: O3

void mathCore::recursive_combine_equiv(expression *a)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (a->contents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(a->contents)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    recursive_combine_equiv(*(expression **)(p_Var1 + 1));
  }
  combine_equiv(a);
  return;
}

Assistant:

void mathCore::recursive_combine_equiv(expression* a) {
	for (auto child : a->contents) {
		mathCore::recursive_combine_equiv(child);
	}
	mathCore::combine_equiv(a);
}